

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
Plan::AddSubTarget(Plan *this,Node *node,Node *dependent,string *err,
                  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *dyndep_walk)

{
  bool bVar1;
  string *psVar2;
  pointer ppVar3;
  Want *pWVar4;
  reference ppNVar5;
  ulong uVar6;
  pair<Edge_*,_Plan::Want> pVar7;
  __enable_if_t<is_constructible<value_type,_pair<Edge_*,_Want>_>::value,_pair<iterator,_bool>_>
  _Var8;
  pair<std::_Rb_tree_const_iterator<Edge_*>,_bool> pVar9;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1a8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1a0;
  iterator i;
  Want *want;
  Want local_154;
  pair<Edge_*,_Plan::Want> local_150;
  _Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_> local_140;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>,_bool> want_ins;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string referenced;
  Edge *edge;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *dyndep_walk_local;
  string *err_local;
  Node *dependent_local;
  Node *node_local;
  Plan *this_local;
  
  referenced.field_2._8_8_ = Node::in_edge(node);
  if ((Edge *)referenced.field_2._8_8_ == (Edge *)0x0) {
    bVar1 = Node::dirty(node);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_60);
      if (dependent != (Node *)0x0) {
        psVar2 = Node::path_abi_cxx11_(dependent);
        std::operator+(&local_a0,", needed by \'",psVar2);
        std::operator+(&local_80,&local_a0,"\',");
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      psVar2 = Node::path_abi_cxx11_(node);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &want_ins.second,"\'",psVar2);
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &want_ins.second,"\'");
      std::operator+(&local_f0,&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_d0,&local_f0," missing and no known rule to make it");
      std::__cxx11::string::operator=((string *)err,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&want_ins.second);
      std::__cxx11::string::~string((string *)local_60);
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Edge::outputs_ready((Edge *)referenced.field_2._8_8_);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_154 = kWantNothing;
      pVar7 = std::make_pair<Edge*&,Plan::Want>((Edge **)((long)&referenced.field_2 + 8),&local_154)
      ;
      local_150.first = pVar7.first;
      local_150.second = pVar7.second;
      _Var8 = std::
              map<Edge*,Plan::Want,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
              ::insert<std::pair<Edge*,Plan::Want>>
                        ((map<Edge*,Plan::Want,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                          *)this,&local_150);
      local_140 = _Var8.first._M_node;
      want_ins.first._M_node._0_1_ = _Var8.second;
      ppVar3 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->(&local_140);
      pWVar4 = &ppVar3->second;
      if ((dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) ||
         (*pWVar4 != kWantToFinish)) {
        bVar1 = Node::dirty(node);
        if ((bVar1) && (*pWVar4 == kWantNothing)) {
          *pWVar4 = kWantToStart;
          EdgeWanted(this,(Edge *)referenced.field_2._8_8_);
          if ((dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) &&
             (bVar1 = Edge::AllInputsReady((Edge *)referenced.field_2._8_8_), bVar1)) {
            ScheduleWork(this,(iterator)local_140._M_node);
          }
        }
        if (dyndep_walk != (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) {
          pVar9 = std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::insert
                            (dyndep_walk,(value_type *)((long)&referenced.field_2 + 8));
          i._M_current = (Node **)pVar9.first._M_node;
        }
        if (((byte)want_ins.first._M_node & 1) == 0) {
          this_local._7_1_ = true;
        }
        else {
          local_1a0._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)
                                   (referenced.field_2._8_8_ + 0x10));
          while( true ) {
            local_1a8._M_current =
                 (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                    ((vector<Node_*,_std::allocator<Node_*>_> *)
                                     (referenced.field_2._8_8_ + 0x10));
            bVar1 = __gnu_cxx::operator!=(&local_1a0,&local_1a8);
            if (!bVar1) break;
            ppNVar5 = __gnu_cxx::
                      __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                      operator*(&local_1a0);
            bVar1 = AddSubTarget(this,*ppNVar5,node,err,dyndep_walk);
            if ((!bVar1) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
              return false;
            }
            __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
            operator++(&local_1a0);
          }
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Plan::AddSubTarget(const Node* node, const Node* dependent, string* err,
                        set<Edge*>* dyndep_walk) {
  Edge* edge = node->in_edge();
  if (!edge) {  // Leaf node.
    if (node->dirty()) {
      string referenced;
      if (dependent)
        referenced = ", needed by '" + dependent->path() + "',";
      *err = "'" + node->path() + "'" + referenced + " missing "
             "and no known rule to make it";
    }
    return false;
  }

  if (edge->outputs_ready())
    return false;  // Don't need to do anything.

  // If an entry in want_ does not already exist for edge, create an entry which
  // maps to kWantNothing, indicating that we do not want to build this entry itself.
  pair<map<Edge*, Want>::iterator, bool> want_ins =
    want_.insert(make_pair(edge, kWantNothing));
  Want& want = want_ins.first->second;

  if (dyndep_walk && want == kWantToFinish)
    return false;  // Don't need to do anything with already-scheduled edge.

  // If we do need to build edge and we haven't already marked it as wanted,
  // mark it now.
  if (node->dirty() && want == kWantNothing) {
    want = kWantToStart;
    EdgeWanted(edge);
    if (!dyndep_walk && edge->AllInputsReady())
      ScheduleWork(want_ins.first);
  }

  if (dyndep_walk)
    dyndep_walk->insert(edge);

  if (!want_ins.second)
    return true;  // We've already processed the inputs.

  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    if (!AddSubTarget(*i, node, err, dyndep_walk) && !err->empty())
      return false;
  }

  return true;
}